

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O3

void __thiscall
proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::Clear(MyMessagePlusExtra *this)

{
  RepeatedField<int> *pRVar1;
  ulong uVar2;
  anon_union_88_1_493b367e_for_MyMessagePlusExtra_3 aVar3;
  int iVar4;
  bool bVar5;
  
  pRVar1 = &(this->field_0)._impl_.repeated_e_;
  aVar3 = this->field_0;
  if (((undefined1  [88])aVar3 & (undefined1  [88])0x4) != (undefined1  [88])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = ((undefined1  [88])aVar3 & (undefined1  [88])0x4) == (undefined1  [88])0x0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size
            (pRVar1,((undefined1  [88])aVar3 & (undefined1  [88])0x4) == (undefined1  [88])0x0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_packed_e_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_packed_unexpected_e_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x38);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  (this->field_0)._impl_.e_ = 0;
  (this->field_0)._impl_._oneof_case_[0] = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void MyMessagePlusExtra::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_preserve_unknown_enum_unittest.MyMessagePlusExtra)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_e_.Clear();
  _impl_.repeated_packed_e_.Clear();
  _impl_.repeated_packed_unexpected_e_.Clear();
  _impl_.e_ = 0;
  clear_o();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}